

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_utilities.cpp
# Opt level: O0

void ShaderUtilities::attach_dir_light(GLuint p_shader_id,DirectionalLight *directional_light)

{
  GLuint GVar1;
  vec<3,_float,_(glm::qualifier)0> local_f8;
  allocator<char> local_e9;
  string local_e8;
  vec<3,_float,_(glm::qualifier)0> local_c8;
  allocator<char> local_b9;
  string local_b8;
  vec<3,_float,_(glm::qualifier)0> local_98;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_61;
  string local_60;
  allocator<char> local_39;
  string local_38;
  DirectionalLight *local_18;
  DirectionalLight *directional_light_local;
  GLuint p_shader_id_local;
  
  local_18 = directional_light;
  directional_light_local._4_4_ = p_shader_id;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"material.shininess",&local_39);
  setFloat(p_shader_id,&local_38,local_18->m_shininess);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  GVar1 = directional_light_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"directional_light.direction",&local_61);
  setVec3(GVar1,&local_60,&local_18->m_direction);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  GVar1 = directional_light_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"directional_light.ambient",&local_89);
  if ((LightingDbWindow::enable_dir_light & 1) == 0) {
    glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_98,0.0);
  }
  else {
    local_98.field_0 = (local_18->m_phong).m_ambient.field_0;
    local_98.field_1 = (local_18->m_phong).m_ambient.field_1;
    local_98.field_2 = (local_18->m_phong).m_ambient.field_2;
  }
  setVec3(GVar1,&local_88,&local_98);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  GVar1 = directional_light_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"directional_light.diffuse",&local_b9);
  if ((LightingDbWindow::enable_dir_light & 1) == 0) {
    glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_c8,0.0);
  }
  else {
    local_c8.field_0 = (local_18->m_phong).m_diffuse.field_0;
    local_c8.field_1 = (local_18->m_phong).m_diffuse.field_1;
    local_c8.field_2 = (local_18->m_phong).m_diffuse.field_2;
  }
  setVec3(GVar1,&local_b8,&local_c8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  GVar1 = directional_light_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"directional_light.specular",&local_e9);
  if ((LightingDbWindow::enable_dir_light & 1) == 0) {
    glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_f8,0.0);
  }
  else {
    local_f8.field_0 = (local_18->m_phong).m_specular.field_0;
    local_f8.field_1 = (local_18->m_phong).m_specular.field_1;
    local_f8.field_2 = (local_18->m_phong).m_specular.field_2;
  }
  setVec3(GVar1,&local_e8,&local_f8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  return;
}

Assistant:

void ShaderUtilities::attach_dir_light(
    const GLuint p_shader_id,
    const DirectionalLight &directional_light) noexcept
{
    // TODO :: Shininess is actually part of Directional Light, as such, we need a separate Material helper class
    setFloat(
        p_shader_id,
        "material.shininess",
        directional_light.m_shininess);
    setVec3(
        p_shader_id,
        "directional_light.direction",
        directional_light.m_direction);
    setVec3(
        p_shader_id,
        "directional_light.ambient",
        LightingDbWindow::enable_dir_light ? directional_light.m_phong.m_ambient
                                           : glm::vec3(0.0f));
    setVec3(
        p_shader_id,
        "directional_light.diffuse",
        LightingDbWindow::enable_dir_light ? directional_light.m_phong.m_diffuse
                                           : glm::vec3(0.0f));
    setVec3(
        p_shader_id,
        "directional_light.specular",
        LightingDbWindow::enable_dir_light ? directional_light.m_phong.m_specular
                                           : glm::vec3(0.0f));
}